

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateQtAutoGeneratorsTargets(cmGlobalGenerator *this,AutogensType *autogens)

{
  cmTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  size_type sVar4;
  reference ppcVar5;
  cmMakefile *pcVar6;
  size_type __n;
  pointer ppVar7;
  string *__x;
  reference name;
  byte local_c42;
  cmTarget *local_bb8;
  pair<cmQtAutoGenerators,_cmTarget_*> local_bb0;
  pair<cmQtAutoGenerators,_const_cmTarget_*> local_818;
  undefined1 local_480 [8];
  cmQtAutoGenerators autogen;
  string local_e8;
  byte local_c3;
  byte local_c2;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  cmTarget *local_78;
  cmTarget *target;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  iterator ti_1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_58;
  iterator ti;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targetNames;
  cmTargets *targets;
  uint i;
  AutogensType *autogens_local;
  cmGlobalGenerator *this_local;
  
  targets._4_4_ = 0;
  do {
    sVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                      (&this->LocalGenerators);
    if (sVar4 <= targets._4_4_) {
      return;
    }
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&this->LocalGenerators,(ulong)targets._4_4_);
    pcVar6 = cmLocalGenerator::GetMakefile(*ppcVar5);
    targetNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)cmMakefile::GetTargets_abi_cxx11_(pcVar6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
    __n = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
          ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  *)targetNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40,__n);
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  *)targetNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      ti_1._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  *)targetNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = std::__detail::operator!=
                        (&local_58,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                          *)&ti_1);
      if (!bVar2) break;
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                             *)&local_58);
      __x = cmTarget::GetName_abi_cxx11_(&ppVar7->second);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40,__x);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                    *)&local_58);
    }
    local_68._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
    while( true ) {
      target = (cmTarget *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
      bVar2 = __gnu_cxx::operator!=
                        (&local_68,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&target);
      if (!bVar2) break;
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)targets._4_4_);
      pcVar6 = cmLocalGenerator::GetMakefile(*ppcVar5);
      name = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_68);
      local_78 = cmMakefile::FindTarget(pcVar6,name,true);
      TVar3 = cmTarget::GetType(local_78);
      if ((((TVar3 == EXECUTABLE) || (TVar3 = cmTarget::GetType(local_78), TVar3 == STATIC_LIBRARY))
          || (TVar3 = cmTarget::GetType(local_78), TVar3 == SHARED_LIBRARY)) ||
         ((TVar3 = cmTarget::GetType(local_78), TVar3 == MODULE_LIBRARY ||
          (TVar3 = cmTarget::GetType(local_78), TVar3 == OBJECT_LIBRARY)))) {
        pcVar1 = local_78;
        std::allocator<char>::allocator();
        local_c2 = 0;
        local_c3 = 0;
        autogen.GenerateAll = false;
        autogen.RunRccFailed = false;
        std::__cxx11::string::string((string *)&local_98,"AUTOMOC",&local_99);
        bVar2 = cmTarget::GetPropertyAsBool(pcVar1,&local_98);
        pcVar1 = local_78;
        if (bVar2) {
LAB_0045218f:
          bVar2 = cmTarget::IsImported(local_78);
          local_c42 = bVar2 ^ 0xff;
        }
        else {
          std::allocator<char>::allocator();
          local_c2 = 1;
          std::__cxx11::string::string((string *)&local_c0,"AUTOUIC",&local_c1);
          local_c3 = 1;
          bVar2 = cmTarget::GetPropertyAsBool(pcVar1,&local_c0);
          pcVar1 = local_78;
          if (bVar2) goto LAB_0045218f;
          std::allocator<char>::allocator();
          autogen.GenerateAll = true;
          std::__cxx11::string::string
                    ((string *)&local_e8,"AUTORCC",(allocator *)&autogen.RelaxedMode);
          autogen.RunRccFailed = true;
          bVar2 = cmTarget::GetPropertyAsBool(pcVar1,&local_e8);
          local_c42 = 0;
          if (bVar2) goto LAB_0045218f;
        }
        if ((autogen.RunRccFailed & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_e8);
        }
        if ((autogen.GenerateAll & 1U) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&autogen.RelaxedMode);
        }
        if ((local_c3 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_c0);
        }
        if ((local_c2 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        }
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
        if ((local_c42 & 1) != 0) {
          cmQtAutoGenerators::cmQtAutoGenerators((cmQtAutoGenerators *)local_480);
          bVar2 = cmQtAutoGenerators::InitializeAutogenTarget
                            ((cmQtAutoGenerators *)local_480,local_78);
          if (bVar2) {
            local_bb8 = local_78;
            std::make_pair<cmQtAutoGenerators&,cmTarget*>
                      (&local_bb0,(cmQtAutoGenerators *)local_480,&local_bb8);
            std::pair<cmQtAutoGenerators,_const_cmTarget_*>::
            pair<cmQtAutoGenerators,_cmTarget_*,_true>(&local_818,&local_bb0);
            std::
            vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
            ::push_back(autogens,&local_818);
            std::pair<cmQtAutoGenerators,_const_cmTarget_*>::~pair(&local_818);
            std::pair<cmQtAutoGenerators,_cmTarget_*>::~pair(&local_bb0);
          }
          cmQtAutoGenerators::~cmQtAutoGenerators((cmQtAutoGenerators *)local_480);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_68);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
    targets._4_4_ = targets._4_4_ + 1;
  } while( true );
}

Assistant:

void cmGlobalGenerator::CreateQtAutoGeneratorsTargets(AutogensType &autogens)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  for(unsigned int i=0; i < this->LocalGenerators.size(); ++i)
    {
    cmTargets& targets =
      this->LocalGenerators[i]->GetMakefile()->GetTargets();
    std::vector<std::string> targetNames;
    targetNames.reserve(targets.size());
    for(cmTargets::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      targetNames.push_back(ti->second.GetName());
      }
    for(std::vector<std::string>::iterator ti = targetNames.begin();
        ti != targetNames.end(); ++ti)
      {
      cmTarget& target = *this->LocalGenerators[i]
                              ->GetMakefile()->FindTarget(*ti, true);
      if(target.GetType() == cmTarget::EXECUTABLE ||
         target.GetType() == cmTarget::STATIC_LIBRARY ||
         target.GetType() == cmTarget::SHARED_LIBRARY ||
         target.GetType() == cmTarget::MODULE_LIBRARY ||
         target.GetType() == cmTarget::OBJECT_LIBRARY)
        {
        if((target.GetPropertyAsBool("AUTOMOC")
              || target.GetPropertyAsBool("AUTOUIC")
              || target.GetPropertyAsBool("AUTORCC"))
            && !target.IsImported())
          {
          cmQtAutoGenerators autogen;
          if(autogen.InitializeAutogenTarget(&target))
            {
            autogens.push_back(std::make_pair(autogen, &target));
            }
          }
        }
      }
    }
#else
  (void)autogens;
#endif
}